

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O3

bool __thiscall Boards::freeput(Boards *this,int x,int y,int turn)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  pointer pvVar4;
  
  iVar1 = (this->board)._M_elems[x]._M_elems[y];
  if (iVar1 == 0) {
    (this->board)._M_elems[x]._M_elems[y] = turn;
    bVar3 = isPutable(this,x,y,1,0,turn);
    if (bVar3) {
      Reverse(this,x,y,1,0,turn);
    }
    bVar3 = isPutable(this,x,y,0,1,turn);
    if (bVar3) {
      Reverse(this,x,y,0,1,turn);
    }
    bVar3 = isPutable(this,x,y,-1,0,turn);
    if (bVar3) {
      Reverse(this,x,y,-1,0,turn);
    }
    bVar3 = isPutable(this,x,y,0,-1,turn);
    if (bVar3) {
      Reverse(this,x,y,0,-1,turn);
    }
    bVar3 = isPutable(this,x,y,1,1,turn);
    if (bVar3) {
      Reverse(this,x,y,1,1,turn);
    }
    bVar3 = isPutable(this,x,y,-1,-1,turn);
    if (bVar3) {
      Reverse(this,x,y,-1,-1,turn);
    }
    bVar3 = isPutable(this,x,y,1,-1,turn);
    if (bVar3) {
      Reverse(this,x,y,1,-1,turn);
    }
    bVar3 = isPutable(this,x,y,-1,1,turn);
    if (bVar3) {
      Reverse(this,x,y,-1,1,turn);
    }
    pvVar4 = (this->delta).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      piVar2 = *(int **)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
      pvVar4 = pvVar4 + 1;
    } while (*piVar2 != 0);
    *piVar2 = turn;
    piVar2[1] = x;
    piVar2[2] = y;
  }
  return iVar1 == 0;
}

Assistant:

bool Boards::freeput(int x, int y, int turn){
	if(board[x][y] != 0)return false;
	int i = 0;
	board[x][y] = turn;
	if(isPutable(x, y, 1, 0, turn)){
		Reverse(x, y, 1, 0, turn);
	}    //右
	if(isPutable(x, y, 0, 1, turn)){
		Reverse(x, y, 0, 1, turn);
	}    //下
	if(isPutable(x, y, -1, 0, turn)){
		Reverse(x, y, -1, 0, turn);
	}    //左
	if(isPutable(x, y, 0, -1, turn)){
		Reverse(x, y, 0, -1, turn);
	}    //上
	if(isPutable(x, y, 1, 1, turn)){
		Reverse(x, y, 1, 1, turn);
	}    //右下
	if(isPutable(x, y, -1, -1, turn)){
		Reverse(x, y, -1, -1, turn);
	}    //左上
	if(isPutable(x, y, 1, -1, turn)){
		Reverse(x, y, 1, -1, turn);
	}    //右上
	if(isPutable(x, y, -1, 1, turn)){
		Reverse(x, y, -1, 1, turn);
	}    //左下

	while(delta[i][0]){ i++; }
	delta[i][0] = turn;
	delta[i][1] = x;
	delta[i][2] = y;
	return true;
}